

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_size(Terminal *term,wchar_t newrows,wchar_t newcols,wchar_t newsavelines)

{
  wchar_t which;
  termchar *ptVar1;
  Backend *pBVar2;
  undefined1 auVar3 [16];
  wchar_t wVar4;
  wchar_t index;
  wchar_t wVar5;
  int index_00;
  tree234 *ptVar6;
  compressed_scrollback_line *pcVar7;
  termline *ptVar8;
  void *pvVar9;
  termline **pptVar10;
  long lVar11;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  termline **ptr;
  wchar_t cols;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  wVar15 = term->rows;
  which = term->alt_which;
  if (((wVar15 == newrows) && (term->cols == newcols)) && (term->savelines == newsavelines)) {
    return;
  }
  if (newrows < L'\x02') {
    newrows = L'\x01';
  }
  cols = L'\x01';
  if (L'\x01' < newcols) {
    cols = newcols;
  }
  term->selstate = LEXICOGRAPHIC;
  (term->selstart).y = L'\0';
  (term->selstart).x = L'\0';
  (term->selend).y = L'\0';
  (term->selend).x = L'\0';
  swap_screen(term,L'\0',false,false);
  term->marg_t = L'\0';
  term->alt_t = L'\0';
  wVar4 = newrows + L'\xffffffff';
  term->marg_b = wVar4;
  term->alt_b = wVar4;
  if (term->rows == L'\xffffffff') {
    ptVar6 = newtree234((cmpfn234_conflict)0x0);
    term->scrollback = ptVar6;
    ptVar6 = newtree234((cmpfn234_conflict)0x0);
    term->screen = ptVar6;
    term->tempsblines = L'\0';
    term->rows = L'\0';
  }
  index = count234(term->scrollback);
  wVar16 = term->rows;
  wVar5 = count234(term->screen);
  if (wVar16 != wVar5) {
    __assert_fail("term->rows == count234(term->screen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x88d,"void term_size(Terminal *, int, int, int)");
  }
  wVar16 = term->rows;
  while (wVar16 < newrows) {
    if (term->tempsblines < L'\x01') {
      ptVar8 = newtermline(term,cols,false);
      ptVar6 = term->screen;
      index_00 = count234(ptVar6);
      addpos234(ptVar6,ptVar8,index_00);
    }
    else {
      if (index < term->tempsblines) {
        __assert_fail("sblen >= term->tempsblines",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0x892,"void term_size(Terminal *, int, int, int)");
      }
      index = index + L'\xffffffff';
      pcVar7 = (compressed_scrollback_line *)delpos234(term->scrollback,index);
      ptVar8 = decompressline(pcVar7);
      safefree(pcVar7);
      ptVar8->temporary = false;
      term->tempsblines = term->tempsblines + L'\xffffffff';
      addpos234(term->screen,ptVar8,0);
      (term->curs).y = (term->curs).y + L'\x01';
      (term->savecurs).y = (term->savecurs).y + L'\x01';
      term->alt_y = term->alt_y + L'\x01';
      (term->alt_savecurs).y = (term->alt_savecurs).y + L'\x01';
    }
    wVar16 = term->rows + L'\x01';
    term->rows = wVar16;
  }
  while (newrows < wVar16) {
    if ((term->curs).y < wVar16 + L'\xffffffff') {
      ptVar8 = (termline *)delpos234(term->screen,wVar16 + L'\xffffffff');
      freetermline(ptVar8);
      wVar5 = index;
    }
    else {
      ptVar8 = (termline *)delpos234(term->screen,0);
      ptVar6 = term->scrollback;
      pcVar7 = compressline(ptVar8);
      wVar5 = index + L'\x01';
      addpos234(ptVar6,pcVar7,index);
      freetermline(ptVar8);
      term->tempsblines = term->tempsblines + L'\x01';
      (term->curs).y = (term->curs).y + L'\xffffffff';
      (term->savecurs).y = (term->savecurs).y + L'\xffffffff';
      term->alt_y = term->alt_y + L'\xffffffff';
      (term->alt_savecurs).y = (term->alt_savecurs).y + L'\xffffffff';
    }
    wVar16 = term->rows + L'\xffffffff';
    term->rows = wVar16;
    index = wVar5;
  }
  if (wVar16 != newrows) {
    __assert_fail("term->rows == newrows",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8b7,"void term_size(Terminal *, int, int, int)");
  }
  wVar5 = count234(term->screen);
  wVar16 = index;
  if (wVar5 != newrows) {
    __assert_fail("count234(term->screen) == newrows",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8b8,"void term_size(Terminal *, int, int, int)");
  }
  for (; newsavelines < index; index = index + L'\xffffffff') {
    pvVar9 = delpos234(term->scrollback,0);
    safefree(pvVar9);
    wVar16 = newsavelines;
  }
  if (wVar16 < term->tempsblines) {
    term->tempsblines = wVar16;
  }
  wVar16 = count234(term->scrollback);
  if (newsavelines < wVar16) {
    __assert_fail("count234(term->scrollback) <= newsavelines",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8c2,"void term_size(Terminal *, int, int, int)");
  }
  wVar16 = count234(term->scrollback);
  if (wVar16 < term->tempsblines) {
    __assert_fail("count234(term->scrollback) >= term->tempsblines",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x8c3,"void term_size(Terminal *, int, int, int)");
  }
  term->disptop = L'\0';
  uVar17 = 0;
  pptVar10 = (termline **)safemalloc((ulong)(uint)newrows,8,0);
  uVar13 = (ulong)(uint)cols;
  lVar11 = uVar13 - 1;
  auVar20._8_4_ = (int)lVar11;
  auVar20._0_8_ = lVar11;
  auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar20 = auVar20 ^ _DAT_00122610;
  do {
    ptVar8 = newtermline(term,cols,false);
    auVar3 = _DAT_00122610;
    local_48 = auVar20._0_4_;
    iStack_44 = auVar20._4_4_;
    iStack_40 = auVar20._8_4_;
    iStack_3c = auVar20._12_4_;
    pptVar10[uVar17] = ptVar8;
    ptVar1 = ptVar8->chars;
    uVar14 = 0;
    auVar18 = _DAT_00122600;
    do {
      auVar19 = auVar18 ^ auVar3;
      if ((bool)(~(auVar19._4_4_ == iStack_44 && local_48 < auVar19._0_4_ ||
                  iStack_44 < auVar19._4_4_) & 1)) {
        *(undefined8 *)((long)&ptVar1->attr + uVar14) = 0x3ffff;
      }
      if ((auVar19._12_4_ != iStack_3c || auVar19._8_4_ <= iStack_40) && auVar19._12_4_ <= iStack_3c
         ) {
        *(undefined8 *)((long)&ptVar1[1].attr + uVar14) = 0x3ffff;
      }
      lVar11 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar11 + 2;
      uVar14 = uVar14 + 0x40;
    } while ((uVar13 * 0x20 + 0x20 & 0xffffffffffffffc0) != uVar14);
    uVar17 = uVar17 + 1;
  } while (uVar17 != (uint)newrows);
  ptr = term->disptext;
  if (L'\0' < wVar15 && ptr != (termline **)0x0) {
    uVar17 = 0;
    do {
      freetermline(term->disptext[uVar17]);
      uVar17 = uVar17 + 1;
    } while ((uint)wVar15 != uVar17);
    ptr = term->disptext;
  }
  safefree(ptr);
  term->disptext = pptVar10;
  term->dispcursx = L'\xffffffff';
  term->dispcursy = L'\xffffffff';
  wVar15 = L'\0';
  ptVar6 = newtree234((cmpfn234_conflict)0x0);
  do {
    ptVar8 = newtermline(term,cols,true);
    addpos234(ptVar6,ptVar8,wVar15);
    wVar15 = wVar15 + L'\x01';
  } while (newrows != wVar15);
  if (term->alt_screen != (tree234 *)0x0) {
    pvVar9 = delpos234(term->alt_screen,0);
    while (pvVar9 != (void *)0x0) {
      safefree(*(void **)((long)pvVar9 + 0x18));
      safefree(pvVar9);
      pvVar9 = delpos234(term->alt_screen,0);
    }
    freetree234(term->alt_screen);
  }
  term->alt_screen = ptVar6;
  term->alt_sblines = L'\0';
  puVar12 = (uchar *)saferealloc(term->tabs,uVar13,1);
  term->tabs = puVar12;
  wVar15 = term->cols;
  if (wVar15 < cols) {
    uVar13 = 0;
    if (L'\0' < wVar15) {
      uVar13 = (ulong)(uint)wVar15;
    }
    do {
      term->tabs[uVar13] = (uVar13 & 7) == 0;
      uVar13 = uVar13 + 1;
    } while ((wchar_t)uVar13 < newcols);
  }
  wVar15 = (term->savecurs).y;
  if (wVar15 < L'\0') {
    wVar16 = L'\0';
LAB_00109bab:
    (term->savecurs).y = wVar16;
  }
  else {
    wVar16 = wVar4;
    if ((uint)newrows <= (uint)wVar15) goto LAB_00109bab;
  }
  if (cols <= (term->savecurs).x) {
    (term->savecurs).x = cols + L'\xffffffff';
  }
  wVar15 = (term->alt_savecurs).y;
  if (wVar15 < L'\0') {
    wVar16 = L'\0';
LAB_00109bda:
    (term->alt_savecurs).y = wVar16;
  }
  else {
    wVar16 = wVar4;
    if ((uint)newrows <= (uint)wVar15) goto LAB_00109bda;
  }
  if (cols <= (term->alt_savecurs).x) {
    (term->alt_savecurs).x = cols + L'\xffffffff';
  }
  wVar15 = (term->curs).y;
  if (wVar15 < L'\0') {
    wVar4 = L'\0';
  }
  else if ((uint)wVar15 < (uint)newrows) goto LAB_00109c0d;
  (term->curs).y = wVar4;
LAB_00109c0d:
  if (cols <= (term->curs).x) {
    (term->curs).x = cols + L'\xffffffff';
  }
  term->wrapnext = false;
  term->alt_wnext = false;
  term->alt_x = L'\0';
  term->alt_y = L'\0';
  term->rows = newrows;
  term->cols = cols;
  term->savelines = newsavelines;
  swap_screen(term,which,false,false);
  term->win_scrollbar_update_pending = true;
  if (term->window_update_pending == false) {
    term->window_update_pending = true;
    queue_toplevel_callback(term_update_callback,term);
  }
  pBVar2 = term->backend;
  if (pBVar2 == (Backend *)0x0) {
    return;
  }
  (*pBVar2->vt->size)(pBVar2,term->cols,term->rows);
  return;
}

Assistant:

void term_size(Terminal *term, int newrows, int newcols, int newsavelines)
{
    tree234 *newalt;
    termline **newdisp, *line;
    int i, j, oldrows = term->rows;
    int sblen;
    int save_alt_which = term->alt_which;

    if (newrows == term->rows && newcols == term->cols &&
        newsavelines == term->savelines)
        return;                        /* nothing to do */

    /* Behave sensibly if we're given zero (or negative) rows/cols */

    if (newrows < 1) newrows = 1;
    if (newcols < 1) newcols = 1;

    deselect(term);
    swap_screen(term, 0, false, false);

    term->alt_t = term->marg_t = 0;
    term->alt_b = term->marg_b = newrows - 1;

    if (term->rows == -1) {
        term->scrollback = newtree234(NULL);
        term->screen = newtree234(NULL);
        term->tempsblines = 0;
        term->rows = 0;
    }

    /*
     * Resize the screen and scrollback. We only need to shift
     * lines around within our data structures, because lineptr()
     * will take care of resizing each individual line if
     * necessary. So:
     *
     *  - If the new screen is longer, we shunt lines in from temporary
     *    scrollback if possible, otherwise we add new blank lines at
     *    the bottom.
     *
     *  - If the new screen is shorter, we remove any blank lines at
     *    the bottom if possible, otherwise shunt lines above the cursor
     *    to scrollback if possible, otherwise delete lines below the
     *    cursor.
     *
     *  - Then, if the new scrollback length is less than the
     *    amount of scrollback we actually have, we must throw some
     *    away.
     */
    sblen = count234(term->scrollback);
    /* Do this loop to expand the screen if newrows > rows */
    assert(term->rows == count234(term->screen));
    while (term->rows < newrows) {
        if (term->tempsblines > 0) {
            compressed_scrollback_line *cline;
            /* Insert a line from the scrollback at the top of the screen. */
            assert(sblen >= term->tempsblines);
            cline = delpos234(term->scrollback, --sblen);
            line = decompressline(cline);
            sfree(cline);
            line->temporary = false;   /* reconstituted line is now real */
            term->tempsblines -= 1;
            addpos234(term->screen, line, 0);
            term->curs.y += 1;
            term->savecurs.y += 1;
            term->alt_y += 1;
            term->alt_savecurs.y += 1;
        } else {
            /* Add a new blank line at the bottom of the screen. */
            line = newtermline(term, newcols, false);
            addpos234(term->screen, line, count234(term->screen));
        }
        term->rows += 1;
    }
    /* Do this loop to shrink the screen if newrows < rows */
    while (term->rows > newrows) {
        if (term->curs.y < term->rows - 1) {
            /* delete bottom row, unless it contains the cursor */
            line = delpos234(term->screen, term->rows - 1);
            freetermline(line);
        } else {
            /* push top row to scrollback */
            line = delpos234(term->screen, 0);
            addpos234(term->scrollback, compressline(line), sblen++);
            freetermline(line);
            term->tempsblines += 1;
            term->curs.y -= 1;
            term->savecurs.y -= 1;
            term->alt_y -= 1;
            term->alt_savecurs.y -= 1;
        }
        term->rows -= 1;
    }
    assert(term->rows == newrows);
    assert(count234(term->screen) == newrows);

    /* Delete any excess lines from the scrollback. */
    while (sblen > newsavelines) {
        line = delpos234(term->scrollback, 0);
        sfree(line);
        sblen--;
    }
    if (sblen < term->tempsblines)
        term->tempsblines = sblen;
    assert(count234(term->scrollback) <= newsavelines);
    assert(count234(term->scrollback) >= term->tempsblines);
    term->disptop = 0;

    /* Make a new displayed text buffer. */
    newdisp = snewn(newrows, termline *);
    for (i = 0; i < newrows; i++) {
        newdisp[i] = newtermline(term, newcols, false);
        for (j = 0; j < newcols; j++)
            newdisp[i]->chars[j].attr = ATTR_INVALID;
    }
    if (term->disptext) {
        for (i = 0; i < oldrows; i++)
            freetermline(term->disptext[i]);
    }
    sfree(term->disptext);
    term->disptext = newdisp;
    term->dispcursx = term->dispcursy = -1;

    /* Make a new alternate screen. */
    newalt = newtree234(NULL);
    for (i = 0; i < newrows; i++) {
        line = newtermline(term, newcols, true);
        addpos234(newalt, line, i);
    }
    if (term->alt_screen) {
        while (NULL != (line = delpos234(term->alt_screen, 0)))
            freetermline(line);
        freetree234(term->alt_screen);
    }
    term->alt_screen = newalt;
    term->alt_sblines = 0;

    term->tabs = sresize(term->tabs, newcols, unsigned char);
    {
        int i;
        for (i = (term->cols > 0 ? term->cols : 0); i < newcols; i++)
            term->tabs[i] = (i % 8 == 0 ? true : false);
    }

    /* Check that the cursor positions are still valid. */
    if (term->savecurs.y < 0)
        term->savecurs.y = 0;
    if (term->savecurs.y >= newrows)
        term->savecurs.y = newrows - 1;
    if (term->savecurs.x >= newcols)
        term->savecurs.x = newcols - 1;
    if (term->alt_savecurs.y < 0)
        term->alt_savecurs.y = 0;
    if (term->alt_savecurs.y >= newrows)
        term->alt_savecurs.y = newrows - 1;
    if (term->alt_savecurs.x >= newcols)
        term->alt_savecurs.x = newcols - 1;
    if (term->curs.y < 0)
        term->curs.y = 0;
    if (term->curs.y >= newrows)
        term->curs.y = newrows - 1;
    if (term->curs.x >= newcols)
        term->curs.x = newcols - 1;
    if (term->alt_y < 0)
        term->alt_y = 0;
    if (term->alt_y >= newrows)
        term->alt_y = newrows - 1;
    if (term->alt_x >= newcols)
        term->alt_x = newcols - 1;
    term->alt_x = term->alt_y = 0;
    term->wrapnext = false;
    term->alt_wnext = false;

    term->rows = newrows;
    term->cols = newcols;
    term->savelines = newsavelines;

    swap_screen(term, save_alt_which, false, false);

    term->win_scrollbar_update_pending = true;
    term_schedule_update(term);
    if (term->backend)
        backend_size(term->backend, term->cols, term->rows);
}